

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node expr_operand_subexpr(Parser *psr)

{
  Node NVar1;
  Parser *psr_local;
  Node subexpr;
  
  lex_next(&psr->lxr);
  NVar1 = parse_subexpr(psr,PREC_NONE);
  lex_expect(&psr->lxr,0x29);
  lex_next(&psr->lxr);
  NVar1._4_4_ = 0;
  return NVar1;
}

Assistant:

static Node expr_operand_subexpr(Parser *psr) {
	// Skip the opening parenthesis
	lex_next(&psr->lxr);

	// Parse the contents of the expression
	Node subexpr = parse_subexpr(psr, PREC_NONE);

	// Expect a closing parenthesis
	lex_expect(&psr->lxr, ')');
	lex_next(&psr->lxr);
	return subexpr;
}